

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageStack.h
# Opt level: O1

void __thiscall
PageStack<Memory::MarkContext::MarkCandidate>::Abort
          (PageStack<Memory::MarkContext::MarkCandidate> *this)

{
  Chunk *page;
  Chunk *pCVar1;
  PagePool *this_00;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  if (this->currentChunk == (Chunk *)0x0) {
    if (this->count != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/PageStack.h"
                         ,0x16e,"(count == 0)","count == 0");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
  }
  else {
    page = this->currentChunk;
    pCVar1 = page->nextChunk;
    while (pCVar1 != (Chunk *)0x0) {
      this->currentChunk = pCVar1;
      this->pageCount = this->pageCount - 1;
      this_00 = this->pagePool;
      if ((page->super_PagePoolPage).isReserved == true) {
        Memory::PagePool::FreeReservedPage(this_00,&page->super_PagePoolPage);
      }
      else {
        page->nextChunk = (Chunk *)this_00->freePageList;
        this_00->freePageList = (PagePoolFreePage *)page;
      }
      page = this->currentChunk;
      pCVar1 = page->nextChunk;
    }
    this->chunkStart = (MarkCandidate *)(page + 1);
    this->chunkEnd = (MarkCandidate *)(page + 0x80);
    this->nextEntry = (MarkCandidate *)(page + 1);
    this->count = 0;
  }
  return;
}

Assistant:

void PageStack<T>::Abort()
{
    // Abandon the current entries in the stack and reset to initialized state.

    if (currentChunk == nullptr)
    {
        Assert(count == 0);
        return;
    }

    // Free all the chunks except the first one
    while (currentChunk->nextChunk != nullptr)
    {
        Chunk * temp = currentChunk;
        currentChunk = currentChunk->nextChunk;
        FreeChunk(temp);
    }

    chunkStart = currentChunk->entries;
    chunkEnd = &currentChunk->entries[EntriesPerChunk];
    nextEntry = chunkStart;

#if DBG
    count = 0;
#endif
}